

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O3

QString * __thiscall
QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
          (QString *__return_storage_ptr__,QSqlRelationalTableModelPrivate *this,QString *tableName,
          QString *fieldName)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QChar QVar3;
  QString *pQVar4;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::reallocData
            ((longlong)__return_storage_ptr__,
             (int)(tableName->d).size + (int)(fieldName->d).size + KeepSize);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  QVar3.ucs = QString::append(__return_storage_ptr__);
  pQVar4 = (QString *)QString::append(QVar3);
  QString::append(pQVar4);
  return __return_storage_ptr__;
}

Assistant:

QString QSqlRelationalTableModelPrivate::fullyQualifiedFieldName(const QString &tableName,
                                                                 const QString &fieldName) const
{
    QString ret;
    ret.reserve(tableName.size() + fieldName.size() + 1);
    ret.append(tableName).append(u'.').append(fieldName);

    return ret;
}